

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncError UTF8ToLatin1(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  byte *pbVar1;
  int iVar2;
  xmlCharEncError xVar3;
  int iVar4;
  byte bVar5;
  xmlCharEncError xVar6;
  long lVar7;
  byte *pbVar8;
  
  iVar4 = (int)in;
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || out == (uchar *)0x0)) {
    return XML_ENC_ERR_INTERNAL;
  }
  if (in == (uchar *)0x0) {
    *inlen = 0;
    *outlen = 0;
    return XML_ENC_ERR_SUCCESS;
  }
  pbVar8 = in + *inlen;
  iVar2 = *outlen;
  lVar7 = 0;
  do {
    xVar6 = (xmlCharEncError)lVar7;
    xVar3 = xVar6;
    if ((pbVar8 <= in) || (xVar3 = XML_ENC_ERR_SPACE, out + iVar2 <= out + lVar7))
    goto LAB_0012a534;
    bVar5 = *in;
    if ((char)bVar5 < '\0') {
      if ((bVar5 & 0xfe) != 0xc2) {
        xVar3 = XML_ENC_ERR_INPUT;
LAB_0012a534:
        *outlen = xVar6;
        *inlen = (int)in - iVar4;
        return xVar3;
      }
      xVar3 = xVar6;
      if ((long)pbVar8 - (long)in < 2) goto LAB_0012a534;
      pbVar1 = in + 1;
      in = in + 1;
      bVar5 = bVar5 << 6 | *pbVar1 & 0x3f;
    }
    out[lVar7] = bVar5;
    in = in + 1;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static xmlCharEncError
UTF8ToLatin1(void *vctxt ATTRIBUTE_UNUSED,
             unsigned char* out, int *outlen,
             const unsigned char* in, int *inlen,
             int flush ATTRIBUTE_UNUSED) {
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned c;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);

    if (in == NULL) {
        *inlen = 0;
        *outlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inend = in + *inlen;
    outend = out + *outlen;
    while (in < inend) {
        if (out >= outend)
            goto done;

	c = *in;

        if (c < 0x80) {
            *out++ = c;
        } else if ((c >= 0xC2) && (c <= 0xC3)) {
            if (inend - in < 2)
                break;
            in++;
            *out++ = (unsigned char) ((c << 6) | (*in & 0x3F));
        } else {
            ret = XML_ENC_ERR_INPUT;
            goto done;
	}

        in++;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}